

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O2

void __thiscall mocker::ir::BuilderContext::checkLogicalExpr(BuilderContext *this,Expression *node)

{
  shared_ptr<mocker::ir::Label> sStack_48;
  shared_ptr<mocker::ir::Label> local_38;
  undefined1 local_28 [32];
  
  if ((this->logicalExprInfo).empty == false) {
    getExprAddr((BuilderContext *)local_28,(NodeID)this);
    local_28._24_8_ = (this->logicalExprInfo).trueNext._M_node[1]._M_next;
    std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)&local_38);
    local_28._16_8_ = (this->logicalExprInfo).falseNext._M_node[1]._M_next;
    std::make_shared<mocker::ir::Label,unsigned_long>((unsigned_long *)&sStack_48);
    emplaceInst<mocker::ir::Branch,std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
              (this,(shared_ptr<mocker::ir::Addr> *)local_28,&local_38,&sStack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_48.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  }
  return;
}

Assistant:

void checkLogicalExpr(const ast::Expression &node) {
    if (logicalExprInfo.empty)
      return;
    emplaceInst<Branch>(
        getExprAddr(node.getID()),
        std::make_shared<Label>(logicalExprInfo.trueNext->getLabelID()),
        std::make_shared<Label>(logicalExprInfo.falseNext->getLabelID()));
  }